

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPAT.cpp
# Opt level: O2

bool __thiscall OpenMD::NPAT::etaConverged(NPAT *this)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = 0.0;
  for (lVar1 = -0x60; lVar1 != 0; lVar1 = lVar1 + 0x20) {
    dVar3 = *(double *)
             ((long)(this->vScale_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                    data_[1] + lVar1) -
            *(double *)
             ((long)(this->oldEta_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                    data_[1] + lVar1);
    dVar2 = dVar2 + dVar3 * dVar3;
  }
  dVar2 = dVar2 / 3.0;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  return dVar2 <= (this->super_NPT).etaTolerance;
}

Assistant:

bool NPAT::etaConverged() {
    int i;
    RealType diffEta, sumEta;

    sumEta = 0;
    for (i = 0; i < 3; i++) {
      sumEta += pow(prevEta_(i, i) - eta(i, i), 2);
    }

    diffEta = sqrt(sumEta / 3.0);

    return (diffEta <= etaTolerance);
  }